

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::createNewAccountantAllocationNode
          (MemoryAccountant *this,size_t size,MemoryAccountantAllocationNode *next)

{
  int iVar1;
  undefined4 extraout_var;
  MemoryAccountantAllocationNode *pMVar2;
  
  iVar1 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                    (this->allocator_,0x30,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                     ,0x199);
  pMVar2 = (MemoryAccountantAllocationNode *)CONCAT44(extraout_var,iVar1);
  pMVar2->size_ = size;
  pMVar2->allocations_ = 0;
  pMVar2->deallocations_ = 0;
  pMVar2->maxAllocations_ = 0;
  pMVar2->currentAllocations_ = 0;
  pMVar2->next_ = next;
  return pMVar2;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::createNewAccountantAllocationNode(size_t size, MemoryAccountantAllocationNode* next) const
{
    MemoryAccountantAllocationNode* node = (MemoryAccountantAllocationNode*) (void*) allocator_->alloc_memory(sizeof(MemoryAccountantAllocationNode), __FILE__, __LINE__);
    node->size_ = size;
    node->allocations_ = 0;
    node->deallocations_ = 0;
    node->maxAllocations_ = 0;
    node->currentAllocations_ = 0;
    node->next_ = next;
    return node;
}